

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.cpp
# Opt level: O3

bool ReadDSK(MemFile *file,shared_ptr<Disk> *disk)

{
  element_type *peVar1;
  Disk *pDVar2;
  pointer puVar3;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  it;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  itEnd;
  code *pcVar4;
  char extraout_AL;
  byte bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  Merge MVar9;
  ssize_t sVar10;
  mapped_type *pmVar11;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar12;
  undefined8 extraout_RAX_01;
  ulong uVar13;
  ulong uVar14;
  undefined8 extraout_RAX_02;
  char *pcVar15;
  Sector *this;
  Data *pDVar16;
  exception *peVar17;
  byte bVar18;
  uint uVar19;
  size_t in_RCX;
  char **args_1;
  undefined8 uVar20;
  DataRate *args_1_00;
  uchar *puVar21;
  key_type *args_1_01;
  uint uVar22;
  size_type __n;
  pointer pcVar23;
  int iVar24;
  ulong uVar25;
  MemFile *this_00;
  byte bVar26;
  bool bVar27;
  uint8_t status2;
  uint8_t status1;
  uint8_t heads;
  uint8_t cyls;
  int uTrackSize;
  EDSK_TRACK th;
  EDSK_OFFSETS eo;
  CylHead cylhead;
  size_t uTail;
  Track track;
  Data data;
  uint8_t ab [256];
  undefined1 local_292 [34];
  uint local_270;
  uint local_26c;
  long local_268;
  short local_260;
  uchar local_25b;
  uchar local_25a;
  uchar local_259;
  byte local_258;
  byte local_257;
  uchar local_256;
  uchar local_255;
  byte local_254;
  byte local_253;
  char local_252;
  key_type local_250;
  shared_ptr<Disk> *local_230;
  uint local_224;
  CylHead local_220;
  uint8_t *local_218;
  ulong local_210;
  uint local_204;
  int local_200;
  DataRate local_1fc;
  undefined1 local_1f8 [16];
  code *local_1e8;
  code *local_1e0;
  vector<Data,_std::allocator<Data>_> local_1d0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  ulong local_198;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_190;
  Encoding local_178;
  int local_174;
  ulong local_170;
  key_type local_168;
  ulong local_148;
  key_type *local_140;
  ulong local_138;
  short local_130;
  byte local_128;
  byte local_127;
  char local_123;
  undefined6 local_116;
  undefined2 uStack_110;
  byte local_108;
  byte local_107;
  ushort local_106;
  byte abStack_104 [212];
  
  local_230 = disk;
  MemFile::rewind(file,(FILE *)disk);
  if (((extraout_AL == '\0') ||
      (sVar10 = MemFile::read(file,(int)&local_138,(void *)0x100,in_RCX), uVar25 = local_138,
      (char)sVar10 == '\0')) ||
     ((local_138 != 0x4445444e45545845 && (local_138 != 0x435043202d20564d)))) {
    return false;
  }
  if ((char)local_107 < '\0') {
    Message<>(msgWarning,"ignoring deprecated \'random data errors\' flag");
    local_107 = local_107 & 0x7f;
  }
  local_292[0x19] = local_108;
  local_292[0x18] = local_107;
  if (local_107 < 3) {
    local_224 = (uint)local_108;
    local_292[8] = local_107;
    local_292._26_8_ = file;
    if (local_108 < 0x67) {
      local_1a8._M_allocated_capacity._0_6_ = local_116;
      local_1a8._M_allocated_capacity._6_2_ = uStack_110;
      local_1b8._8_8_ = (pointer)0xe;
      local_1a8._M_local_buf[0xe] = '\0';
      local_1b8._0_8_ = &local_1a8;
      util::trim((string *)local_1f8,(string *)local_1b8);
      peVar1 = (local_230->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"creator","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&peVar1->metadata,&local_250);
      std::__cxx11::string::operator=((string *)pmVar11,(string *)local_1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((shared_ptr<Disk> *)local_1f8._0_8_ != (shared_ptr<Disk> *)&local_1e8) {
        operator_delete((void *)local_1f8._0_8_,(ulong)((long)local_1e8 + 1));
      }
      local_210 = uVar25 & 0xff;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._0_8_ != &local_1a8) {
        operator_delete((void *)local_1b8._0_8_,
                        CONCAT26(local_1a8._M_allocated_capacity._6_2_,
                                 local_1a8._M_allocated_capacity._0_6_) + 1);
      }
      local_218 = AllocMem(0xff00);
      this_00 = (MemFile *)local_292._26_8_;
      if (local_224 != 0) {
        args_1_00 = (DataRate *)(ulong)local_292[8];
        local_204 = (uint)local_292[8];
        local_292._10_8_ = (key_type *)0x0;
        local_170 = 0;
        bVar5 = local_292[8];
        do {
          if (bVar5 == 0) {
            bVar5 = 0;
          }
          else {
            local_148 = (ulong)((int)local_292._10_8_ * local_204);
            uVar19 = 0;
            do {
              local_292._2_4_ = uVar19;
              CylHead::CylHead(&local_220,(int)local_292._10_8_,local_292._2_4_);
              local_200 = MemFile::tell(this_00);
              if ((int)local_210 == 0x45) {
                bVar5 = abStack_104[(uint)local_292._2_4_ + local_148];
                local_270 = (uint)bVar5 << 8;
                args_1_00 = (DataRate *)((ulong)bVar5 << 8);
                if (bVar5 != 0) goto LAB_0018c79a;
                pDVar2 = (local_230->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                Track::Track((Track *)local_1f8,0);
                Disk::write(pDVar2,(int)&local_220,(Track *)local_1f8,(size_t)args_1_00);
LAB_0018c92d:
                std::vector<Sector,_std::allocator<Sector>_>::~vector
                          ((vector<Sector,_std::allocator<Sector>_> *)(local_1f8 + 8));
              }
              else {
                local_270 = (uint)local_106;
LAB_0018c79a:
                if (0x27 < (uint)local_292._10_4_) {
                  iVar7 = MemFile::tell(this_00);
                  iVar8 = MemFile::size(this_00);
                  if (iVar7 == iVar8) {
                    local_1f8._0_8_ = CH((int)local_292._10_8_,local_292._2_4_);
                    Message<char_const*>
                              (msgWarning,"%s track header is missing, assuming blank track",
                               (char **)local_1f8);
                    pDVar2 = (local_230->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr;
                    Track::Track((Track *)local_1f8,0);
                    Disk::write(pDVar2,(int)&local_220,(Track *)local_1f8,(size_t)args_1_00);
                    goto LAB_0018c92d;
                  }
                }
                sVar10 = MemFile::read(this_00,(int)&local_268,(void *)0x18,(size_t)args_1_00);
                if ((char)sVar10 == '\0') {
                  peVar17 = (exception *)__cxa_allocate_exception(0x10);
                  util::exception::exception<char_const(&)[20],CylHead&>
                            (peVar17,(char (*) [20])"short file reading ",&local_220);
LAB_0018d562:
                  __cxa_throw(peVar17,&util::exception::typeinfo,std::runtime_error::~runtime_error)
                  ;
                }
                if (local_260 != 0x6f66 || local_268 != 0x6e492d6b63617254) {
                  peVar17 = (exception *)__cxa_allocate_exception(0x10);
                  util::exception::exception<char_const(&)[28],CylHead&>
                            (peVar17,(char (*) [28])"track signature missing on ",&local_220);
                  goto LAB_0018d562;
                }
                if (7 < local_254 && (int)local_210 != 0x45) {
                  local_1f8._0_8_ = SizeStr((uint)local_254);
                  local_1b8._0_8_ = CH((int)local_292._10_8_,local_292._2_4_);
                  Message<char_const*,char_const*>
                            (msgWarning,"invalid sector size code (%s) on %s",(char **)local_1f8,
                             (char **)local_1b8);
                }
                uVar19 = (uint)local_292._10_8_ ^ (uint)local_258;
                args_1 = (char **)(ulong)uVar19;
                uVar12 = 0;
                if (local_292._2_4_ != (uint)local_257 || uVar19 != 0) {
                  if ((uint)local_292._10_8_ == (uint)local_258) {
                    local_1f8._0_8_ = HeadStr((uint)local_257);
                    local_1b8._0_8_ = HeadStr(local_292._2_4_);
                    args_1 = (char **)local_1b8;
                    Message<char_const*,char_const*>
                              (msgWarning,"header side %s != head %s",(char **)local_1f8,args_1);
                    uVar12 = extraout_RAX;
                  }
                  else {
                    local_1f8._0_8_ = CylStr((uint)local_258);
                    local_1b8._0_8_ = CylStr((int)local_292._10_8_);
                    args_1 = (char **)local_1b8;
                    Message<char_const*,char_const*>
                              (msgWarning,"header track %s != cyl %s",(char **)local_1f8,args_1);
                    uVar12 = extraout_RAX_00;
                  }
                }
                uVar20 = CONCAT71((int7)((ulong)args_1 >> 8),local_25b);
                uVar19 = (uint)CONCAT71((int7)((ulong)uVar12 >> 8),local_256);
                if (local_25b != '\0' && local_256 == '\0') {
                  local_256 = local_25b;
                  local_25b = '\0';
                  uVar19 = (uint)uVar20;
                  uVar20 = 0;
                }
                if (local_25a != '\0' && local_255 == '\0') {
                  local_255 = local_25a;
                  local_25a = '\0';
                }
                if ((((char)uVar20 != '\0') || (local_25a != '\0')) || (local_259 != '\0')) {
                  local_1f8._0_8_ = CH((int)local_292._10_8_,local_292._2_4_);
                  Message<unsigned_char&,unsigned_char&,unsigned_char&,char_const*>
                            (msgWarning,"unused fields are non-zero (%02X %02X %02X) on %s",
                             &local_25b,&local_25a,&local_259,(char **)local_1f8);
                  uVar19 = (uint)CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),local_256);
                }
                args_1_00 = (DataRate *)(ulong)(uVar19 - 1);
                local_1fc = _250K;
                if ((byte)(uVar19 - 1) < 3) {
                  args_1_00 = ReadDSK::abEDSKRates;
                  local_1fc = ReadDSK::abEDSKRates[uVar19 & 0xff];
                }
                bVar27 = local_255 == '\x01';
                Track::Track((Track *)local_1b8,(uint)local_253);
                uVar19 = (uint)local_253;
                uVar22 = ((uint)local_253 * 8 + 0x117 & 0xf00) - 0x18;
                if ((int)(uVar19 * 8) < (int)uVar22) {
                  iVar7 = MemFile::size((MemFile *)local_292._26_8_);
                  iVar8 = MemFile::tell((MemFile *)local_292._26_8_);
                  if (iVar7 - iVar8 != uVar19 * 8) goto LAB_0018cac2;
                  local_1f8._0_8_ = CH((int)local_292._10_8_,local_292._2_4_);
                  Message<char_const*>
                            (msgWarning,"%s track header is shorter than index size",
                             (char **)local_1f8);
                }
                else {
LAB_0018cac2:
                  sVar10 = MemFile::read((MemFile *)local_292._26_8_,(int)local_218,
                                         (void *)(ulong)uVar22,(size_t)args_1_00);
                  if ((char)sVar10 == '\0') {
                    peVar17 = (exception *)__cxa_allocate_exception(0x10);
                    util::exception::exception<char_const(&)[20],CylHead&,char_const(&)[16]>
                              (peVar17,(char (*) [20])"short file reading ",&local_220,
                               (char (*) [16])" sector headers");
                    __cxa_throw(peVar17,&util::exception::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                }
                if (local_253 != 0) {
                  local_178 = bVar27 + MFM;
                  uVar25 = 0;
                  do {
                    Header::Header((Header *)&local_250,(uint)local_218[uVar25 * 8],
                                   (uint)local_218[uVar25 * 8 + 1],(uint)local_218[uVar25 * 8 + 2],
                                   (uint)local_218[uVar25 * 8 + 3]);
                    Sector::Sector((Sector *)local_1f8,local_1fc,local_178,(Header *)&local_250,0);
                    pcVar4 = local_1e0;
                    uVar13 = (ulong)(local_253 - 1);
                    iVar7 = (int)uVar25;
                    if (iVar7 < (int)(local_253 - 1)) {
                      uVar13 = 0;
                      local_1e0 = (code *)(ulong)CONCAT14(local_252,local_1e0._0_4_);
                      if ((local_252 == 'R') || (local_252 == 'N')) {
                        local_1e0 = (code *)((ulong)pcVar4 & 0xffffffff);
                      }
                    }
                    local_292[1] = local_218[uVar25 * 8 + 4];
                    uVar14 = CONCAT71((int7)(uVar13 >> 8),local_292[1]);
                    bVar5 = local_218[uVar25 * 8 + 5];
                    local_26c = bVar5 & 0x20;
                    bVar26 = (local_292[1] & 0x20) == 0 | (byte)(local_26c >> 5);
                    uVar13 = uVar14;
                    local_292[0] = bVar5;
                    if (bVar26 == 0) {
                      Sector::set_badidcrc((Sector *)local_1f8,true);
                      uVar14 = CONCAT71((int7)((ulong)extraout_RAX_02 >> 8),local_292[1]);
                      uVar13 = uVar14 & 0xffffffff;
                    }
                    uVar13 = uVar13 & 0xffffffffffffff20;
                    if (((char)uVar13 != '\0') && ((local_292[0] & 1) != 0)) {
                      uVar13 = local_1f8._8_8_ & 0xffffffff;
                      pcVar15 = CHSR((int)local_292._10_8_,local_292._2_4_,iVar7,local_1f8._8_4_);
                      local_250._M_dataplus._M_p._0_4_ = (uint)pcVar15;
                      local_250._M_dataplus._M_p._4_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
                      Message<char_const*>
                                (msgWarning,"unsupported placeholder sector on %s",
                                 (char **)&local_250);
                      local_292[0] = local_292[0] & 0xfe;
                      uVar14 = (ulong)local_292[1];
                    }
                    bVar6 = (byte)uVar14;
                    if (((uVar14 & 0x4a) != 0) ||
                       (args_1_00 = (DataRate *)CONCAT71((int7)(uVar13 >> 8),local_292[0]),
                       (local_292[0] & 0x8c) != 0)) {
                      pcVar15 = CHSR((int)local_292._10_8_,local_292._2_4_,iVar7,local_1f8._8_4_);
                      local_250._M_dataplus._M_p._0_4_ = (uint)pcVar15;
                      local_250._M_dataplus._M_p._4_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
                      puVar21 = local_292;
                      Message<unsigned_char&,unsigned_char&,char_const*>
                                (msgWarning,"invalid status (ST1=%02X ST2=%02X) for %s",
                                 local_292 + 1,puVar21,(char **)&local_250);
                      bVar6 = local_292[1] & 0xb5;
                      args_1_00 = (DataRate *)
                                  (CONCAT71((int7)((ulong)puVar21 >> 8),local_292[0]) &
                                  0xffffffffffffff73);
                      local_292[0] = (byte)args_1_00;
                      local_292[1] = bVar6;
                    }
                    bVar18 = (byte)args_1_00;
                    if ((bVar6 != 0 || bVar18 != 0x40 && bVar18 != 0) &&
                       (bVar6 != 0x80 || bVar18 != 0)) {
                      if (((bVar6 != 0x20) || (bVar18 != 0 && (bVar18 & 0xbf) != 0x20)) &&
                         (1 < bVar6 || bVar18 != 1)) {
                        bVar27 = ((ulong)args_1_00 & 0xef) == 0;
                        args_1_00 = (DataRate *)CONCAT71((int7)((ulong)args_1_00 >> 8),bVar27);
                        if ((bVar6 != 4) || (!bVar27)) {
                          pcVar15 = CHSR((int)local_292._10_8_,local_292._2_4_,iVar7,local_1f8._8_4_
                                        );
                          local_250._M_dataplus._M_p._0_4_ = (uint)pcVar15;
                          local_250._M_dataplus._M_p._4_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
                          args_1_00 = (DataRate *)local_292;
                          Message<unsigned_char&,unsigned_char&,char_const*>
                                    (msgWarning,"unusual status flags (ST1=%02X ST2=%02X) for %s",
                                     local_292 + 1,(uchar *)args_1_00,(char **)&local_250);
                        }
                      }
                    }
                    iVar7 = Sector::size((Sector *)local_1f8);
                    local_198 = uVar25;
                    if ((int)local_210 == 0x45) {
                      uVar19 = (uint)*(ushort *)(local_218 + uVar25 * 8 + 6);
                      uVar22 = bVar5 & 1 ^ 1;
                      if ((iVar7 < (int)uVar19) && (local_26c != 0)) {
                        args_1_00 = (DataRate *)((long)(ulong)uVar19 / (long)iVar7 & 0xffffffff);
                        if ((uVar19 == 0xc000) || ((int)((long)(ulong)uVar19 % (long)iVar7) == 0)) {
                          if (uVar19 == 0xc000) {
                            args_1_00 = (DataRate *)0x3;
                          }
                          uVar22 = (uint)args_1_00;
                          uVar19 = (uint)((long)(ulong)uVar19 / (long)(int)uVar22);
                        }
                      }
                    }
                    else {
                      uVar19 = Sector::SizeCodeToLength((uint)local_254);
                      uVar22 = bVar5 & 1 ^ 1;
                    }
                    if (0 < (int)uVar22) {
                      local_292[9] = (bVar5 & 1) == 0 & bVar26;
                      args_1_00 = (DataRate *)(long)iVar7;
                      local_174 = (uint)((bVar5 & 0x40) == 0) * 3 + 0xf8;
                      local_140 = (key_type *)args_1_00;
                      do {
                        __n = (size_type)(int)uVar19;
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                                  (&local_190,__n,(allocator_type *)&local_250);
                        iVar24 = (int)local_190.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                 (int)local_190.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start;
                        iVar8 = MemFile::remaining((MemFile *)local_292._26_8_);
                        uVar12 = local_292._26_8_;
                        if (iVar8 < iVar24) {
                          peVar17 = (exception *)__cxa_allocate_exception(0x10);
                          util::exception::
                          exception<char_const(&)[20],CylHead&,char_const(&)[9],int&>
                                    (peVar17,(char (*) [20])"short file reading ",&local_220,
                                     (char (*) [9])0x1b0f43,(int *)(local_1f8 + 8));
                          __cxa_throw(peVar17,&util::exception::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        memcpy(local_190.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               ((iterator *)(local_292._26_8_ + 0x58))->_M_current,(long)iVar24);
                        ((iterator *)(uVar12 + 0x58))->_M_current =
                             ((iterator *)(uVar12 + 0x58))->_M_current + iVar24;
                        if (opt.fix != 0) {
                          peVar1 = (local_230->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)
                                   ._M_ptr;
                          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_168,"creator","");
                          pmVar11 = std::
                                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::operator[](&peVar1->metadata,&local_168);
                          args_1_00 = (DataRate *)0x3;
                          std::__cxx11::string::substr((ulong)&local_250,(ulong)pmVar11);
                          iVar8 = std::__cxx11::string::compare((char *)&local_250);
                          bVar27 = false;
                          if ((iVar8 == 0 && local_26c == 0) &&
                             (bVar27 = false, iVar7 < (int)uVar19)) {
                            bVar27 = (int)uVar19 % iVar7 == 0;
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_250._M_dataplus._M_p != &local_250.field_2) {
                            operator_delete(local_250._M_dataplus._M_p,
                                            local_250.field_2._M_allocated_capacity + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_168._M_dataplus._M_p != &local_168.field_2) {
                            operator_delete(local_168._M_dataplus._M_p,
                                            local_168.field_2._M_allocated_capacity + 1);
                          }
                          if (bVar27) {
                            args_1_00 = (DataRate *)(local_1f8._8_8_ & 0xffffffff);
                            pcVar15 = CHSR((int)local_292._10_8_,local_292._2_4_,(int)local_198,
                                           local_1f8._8_4_);
                            local_250._M_dataplus._M_p._0_4_ = (uint)pcVar15;
                            local_250._M_dataplus._M_p._4_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
                            Message<char_const*>
                                      (msgFix,"dropping suspicious excess data on %s",
                                       (char **)&local_250);
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_190,(size_type)local_140);
                          }
                        }
                        if (((local_26c != 0) && ((int)uVar19 % iVar7 == 1)) &&
                           (local_190.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start[__n - 1] == '{')) {
                          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                    (&local_190,__n - 1);
                          uVar19 = (uint)(__n - 1);
                        }
                        if ((int)local_210 == 0x45) {
                          if (local_292[9] != 0) goto LAB_0018cfad;
                          args_1_00 = (DataRate *)(local_1f8._8_8_ & 0xffffffff);
                          pcVar15 = CHSR((int)local_292._10_8_,local_292._2_4_,(int)local_198,
                                         local_1f8._8_4_);
                          local_250._M_dataplus._M_p._0_4_ = (uint)pcVar15;
                          local_250._M_dataplus._M_p._4_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
                          Message<char_const*>
                                    (msgWarning,
                                     "ignoring stored data on %s, which has no data field",
                                     (char **)&local_250);
                        }
                        else if (local_292[9] != 0) {
                          if (iVar7 < (int)uVar19) {
                            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                      (&local_190,(long)(int)uVar19);
                          }
LAB_0018cfad:
                          args_1_00 = (DataRate *)(ulong)(byte)local_174;
                          MVar9 = Sector::add((Sector *)local_1f8,(Data *)&local_190,local_26c != 0,
                                              (byte)local_174);
                          if (MVar9 == Unchanged) {
                            args_1_00 = (DataRate *)(local_1f8._8_8_ & 0xffffffff);
                            pcVar15 = CHSR((int)local_292._10_8_,local_292._2_4_,(int)local_198,
                                           local_1f8._8_4_);
                            local_250._M_dataplus._M_p._0_4_ = (uint)pcVar15;
                            local_250._M_dataplus._M_p._4_4_ = (undefined4)((ulong)pcVar15 >> 0x20);
                            Message<char_const*>
                                      (msgInfo,"ignored identical data copy of %s",
                                       (char **)&local_250);
                          }
                        }
                        if (local_190.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_190.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_190.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_190.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        uVar22 = uVar22 - 1;
                      } while (uVar22 != 0);
                    }
                    Track::add((Track *)local_1b8,(Sector *)local_1f8);
                    std::vector<Data,_std::allocator<Data>_>::~vector(&local_1d0);
                    uVar25 = local_198 + 1;
                  } while (uVar25 < local_253);
                }
                this_00 = (MemFile *)local_292._26_8_;
                args_1_01 = &local_250;
                uVar19 = MemFile::tell((MemFile *)local_292._26_8_);
                uVar25 = (ulong)uVar19;
                MemFile::seek(this_00,local_270 + local_200);
                if ((int)local_210 == 0x45) {
                  uVar19 = uVar19 + 0xff & 0xffffff00;
                  uVar25 = (ulong)uVar19;
                  uVar22 = uVar19 - local_200;
                  if (uVar22 != local_270) {
                    if ((uVar22 & 0xffff) == local_270) {
                      local_1f8._0_8_ = CH((int)local_292._10_8_,local_292._2_4_);
                      local_250._M_dataplus._M_p._0_4_ = uVar22;
                      Message<char_const*,int,int&>
                                (msgWarning,"%s size (%u) does not match index entry (%u)",
                                 (char **)local_1f8,(int *)args_1_01,(int *)&local_270);
                      MemFile::seek(this_00,uVar19);
                      args_1_00 = (DataRate *)args_1_01;
                    }
                    else {
                      local_1f8._0_8_ = CH((int)local_292._10_8_,local_292._2_4_);
                      local_250._M_dataplus._M_p._0_4_ = uVar22;
                      Message<char_const*,int,int&>
                                (msgWarning,"%s size (%u) does not match index entry (%u)",
                                 (char **)local_1f8,(int *)args_1_01,(int *)&local_270);
                      args_1_00 = (DataRate *)args_1_01;
                    }
                  }
                }
                uVar25 = CONCAT71((int7)(uVar25 >> 8),1);
                if ((local_170 & 1) == 0) {
                  bVar27 = Track::is_8k_sector((Track *)local_1b8);
                  if (bVar27) {
                    this = Track::operator[]((Track *)local_1b8,0);
                    iVar7 = Sector::data_size(this);
                    if (iVar7 == 0x1800) {
                      Message<>(msgWarning,"missing checksums needed to verify 8K sector integrity")
                      ;
                      goto LAB_0018d1cf;
                    }
                  }
                  uVar25 = 0;
                }
LAB_0018d1cf:
                Disk::write((local_230->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                            ,(int)&local_220,local_1b8,(size_t)args_1_00);
                std::vector<Sector,_std::allocator<Sector>_>::~vector
                          ((vector<Sector,_std::allocator<Sector>_> *)(local_1b8 + 8));
                local_170 = uVar25;
              }
              bVar5 = local_292[8];
              uVar19 = local_292._2_4_ + 1;
            } while (local_292._2_4_ + 1 < local_204);
          }
          uVar19 = (int)local_292._10_8_ + 1;
          args_1_00 = (DataRate *)(ulong)uVar19;
          local_292._10_8_ = args_1_00;
        } while (uVar19 < local_224);
      }
      if ((int)local_210 == 0x45) {
        sVar10 = MemFile::read(this_00,(int)&local_250,(void *)0xf,1);
        if ((int)sVar10 != 0) {
          if (CONCAT35((undefined3)local_250._M_string_length,
                       (int5)((ulong)local_250._M_dataplus._M_p >> 0x18)) == 0x6f666e492d746573 &&
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x492d74657366664f) {
            Range::Range((Range *)local_1b8,local_224,(uint)local_292[8]);
            local_1f8._0_8_ = local_230;
            local_1e0 = std::
                        _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/types/dsk.cpp:368:37)>
                        ::_M_invoke;
            local_1e8 = std::
                        _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/types/dsk.cpp:368:37)>
                        ::_M_manager;
            local_1f8._8_8_ = this_00;
            Range::each((Range *)local_1b8,(function<void_(const_CylHead_&)> *)local_1f8,false);
            if (local_1e8 != (code *)0x0) {
              (*local_1e8)(local_1f8,local_1f8,3);
            }
          }
          else {
            iVar7 = MemFile::tell(this_00);
            MemFile::seek(this_00,iVar7 + -0xf);
          }
        }
      }
      do {
        sVar10 = MemFile::read((MemFile *)local_292._26_8_,(int)&local_138,(void *)0x100,1);
        if ((int)sVar10 == 0) {
LAB_0018d3cc:
          uVar12 = local_292._26_8_;
          iVar7 = MemFile::size((MemFile *)local_292._26_8_);
          iVar8 = MemFile::tell((MemFile *)uVar12);
          pcVar23 = (pointer)(long)(iVar7 - iVar8);
          local_1f8._0_8_ = pcVar23;
          if (iVar7 - iVar8 != 0) {
            pDVar16 = MemFile::data((MemFile *)uVar12);
            puVar3 = (pDVar16->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar7 = MemFile::tell((MemFile *)uVar12);
            puVar21 = puVar3 + iVar7;
            iVar7 = bcmp(puVar21,puVar3 + (long)iVar7 + 1,(size_t)(pcVar23 + -1));
            if (iVar7 == 0) {
              Message<unsigned_long&,unsigned_char_const&>
                        (msgWarning,"file ends with %u bytes of %02X filler",
                         (unsigned_long *)local_1f8,puVar21);
            }
            else {
              Message<unsigned_long&>
                        (msgWarning,"%u bytes of unused data found at end of file:",
                         (unsigned_long *)local_1f8);
              uVar12 = local_292._26_8_;
              pDVar16 = MemFile::data((MemFile *)local_292._26_8_);
              it._M_current =
                   (pDVar16->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
              pDVar16 = MemFile::data((MemFile *)uVar12);
              itEnd._M_current =
                   (pDVar16->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              iVar7 = MemFile::tell((MemFile *)uVar12);
              util::
              hex_dump<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        (it,itEnd,iVar7,(colour *)0x0,0x10);
            }
          }
          peVar1 = (local_230->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__cxx11::string::_M_replace
                    ((ulong)&peVar1->strType,0,(char *)(peVar1->strType)._M_string_length,0x1b23d1);
          FreeMem(local_218);
          return true;
        }
        if ((local_130 != 0x6f66 || local_138 != 0x6e492d6b63617254) || (local_123 != '\0')) {
          iVar7 = MemFile::tell((MemFile *)local_292._26_8_);
          MemFile::seek((MemFile *)local_292._26_8_,iVar7 + -0x100);
          goto LAB_0018d3cc;
        }
        local_1f8._0_8_ = CH((uint)local_128,(uint)local_127);
        Message<char_const*>
                  (msgWarning,"blank %s should not have EDSK track block",(char **)local_1f8);
      } while( true );
    }
    peVar17 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[25],unsigned_char&,char_const(&)[2]>
              (peVar17,(char (*) [25])"invalid cylinder count (",local_292 + 0x19,
               (char (*) [2])0x1aefd0);
  }
  else {
    peVar17 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[21],unsigned_char&,char_const(&)[2]>
              (peVar17,(char (*) [21])"invalid head count (",local_292 + 0x18,(char (*) [2])0x1aefd0
              );
  }
  __cxa_throw(peVar17,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool ReadDSK(MemFile& file, std::shared_ptr<Disk>& disk)
{
    uint8_t ab[256];
    if (!file.rewind() || !file.read(&ab, sizeof(ab)))
        return false;

    auto peh = reinterpret_cast<EDSK_HEADER*>(ab);
    if (memcmp(peh->szSignature, EDSK_SIGNATURE, 8) &&  // match: "EXTENDED" only
        memcmp(peh->szSignature, DSK_SIGNATURE, 8)) // match: "MV - CPC"
        return false;

    auto pbIndex = reinterpret_cast<const uint8_t*>(peh + 1);
    auto max_cyls = (sizeof(ab) - sizeof(EDSK_HEADER)) / MAX_SIDES;
    bool fEDSK = peh->szSignature[0] == EDSK_SIGNATURE[0];

    // Warn if the deprecated 'random data errors' flag is set
    if (peh->bSides & 0x80)
    {
        Message(msgWarning, "ignoring deprecated 'random data errors' flag");
        peh->bSides &= ~0x80;
    }

    uint8_t cyls = peh->bTracks;
    uint8_t heads = peh->bSides;

    if (heads > MAX_SIDES)
        throw util::exception("invalid head count (", heads, ")");
    else if (cyls > MAX_TRACKS || cyls > max_cyls)
        throw util::exception("invalid cylinder count (", cyls, ")");

    disk->metadata["creator"] = util::trim(std::string(peh->szCreator, sizeof(peh->szCreator)));

    MEMORY mem(ESDK_MAX_TRACK_SIZE);
    bool fWarned6K = false;

    for (uint8_t cyl = 0; cyl < cyls; ++cyl)
    {
        for (uint8_t head = 0; head < heads; ++head)
        {
            CylHead cylhead(cyl, head);
            static const DataRate abEDSKRates[] = { DataRate::_250K, DataRate::_250K, DataRate::_500K, DataRate::_1M };

            // Remember the start position
            auto uTrackStart = file.tell();

            // EDSK supports variable track size, DSK has it fixed for the entire image
            auto uTrackSize = fEDSK ? (pbIndex[cyl * heads + head] << 8) : ((peh->abTrackSize[1] << 8) | peh->abTrackSize[0]);

            // EDSK doesn't store blank tracks, as indicated by zero size in the index
            if (fEDSK && !uTrackSize)
            {
                disk->write(cylhead, Track());
                continue;
            }

            // SugarBox (<= 0.22) doesn't write blank tracks at the end of the disk.
            if (cyl >= 40 && file.tell() == file.size())
            {
                Message(msgWarning, "%s track header is missing, assuming blank track", CH(cyl, head));
                disk->write(cylhead, Track());
                continue;
            }

            EDSK_TRACK th;
            if (!file.read(&th, sizeof(th)))
                throw util::exception("short file reading ", cylhead);

            // Check for "Track-Info", tolerating \r\n missing in bad images (Addams Family)
            if (memcmp(th.signature, EDSK_TRACK_SIG, 10))
                throw util::exception("track signature missing on ", cylhead);

            // Warn if the track sector size is invalid
            if (!fEDSK && th.size > SIZE_MASK_765)
                Message(msgWarning, "invalid sector size code (%s) on %s", SizeStr(th.size), CH(cyl, head));

            if (th.track != cyl || th.side != head)
            {
                if (th.track != cyl) Message(msgWarning, "header track %s != cyl %s", CylStr(th.track), CylStr(cyl));
                else Message(msgWarning, "header side %s != head %s", HeadStr(th.side), HeadStr(head));
            }

            // SAMdisk initially implemented John Elliot's rate+encoding extension in the wrong place.
            // If we find values in the wrong place, and none set in the right place, move them over!
            if (th.rate == 0 && th.unused[0]) { th.rate = th.unused[0]; th.unused[0] = 0; }
            if (th.encoding == 0 && th.unused[1]) { th.encoding = th.unused[1]; th.unused[1] = 0; }

            // Warn if the unused fields are used
            if (th.unused[0] || th.unused[1] || th.unused[2])
                Message(msgWarning, "unused fields are non-zero (%02X %02X %02X) on %s", th.unused[0], th.unused[1], th.unused[2], CH(cyl, head));

            DataRate datarate = (th.rate >= 1 && th.rate <= 3) ? abEDSKRates[th.rate] : DataRate::_250K;
            Encoding encoding = (th.encoding != 1) ? Encoding::MFM : Encoding::FM;
            Track track(th.sectors);

            // Determine the track header size, and the start of the data beyond it
            // Round the header size to the next 256-byte boundary
            int uSectorHeaders = (sizeof(EDSK_TRACK) + th.sectors * sizeof(EDSK_SECTOR) + 0xff) & ~0xff;
            uSectorHeaders -= sizeof(EDSK_TRACK);
            int uMinimum = th.sectors * sizeof(EDSK_SECTOR);

            // CPCDiskXP writes a truncated track header if the final track is blank.
            // Check if only the minimum header size has been supplied.
            if (uMinimum < uSectorHeaders && (file.size() - file.tell()) == uMinimum)
                Message(msgWarning, "%s track header is shorter than index size", CH(cyl, head));
            else if (!file.read(mem, uSectorHeaders))
                throw util::exception("short file reading ", cylhead, " sector headers");

            for (uint8_t sec = 0; sec < th.sectors; ++sec)
            {
                auto ps = &reinterpret_cast<EDSK_SECTOR*>(mem.pb)[sec];
                Sector sector(datarate, encoding, Header(ps->track, ps->side, ps->sector, ps->size));

                // Set gap3 on all but final setor
                if (sec < th.sectors - 1)
                {
                    sector.gap3 = th.gap3;

                    // If the sector uses a default gap3 size, clear it. This allows overrides by stored gap3
                    // in ALLGAPS images, and also prevents the default value showing up in track scans.
                    // If the same image is written back, any unset gap3 will be restored to the same value.
                    if (sector.gap3 == EDSK_DEFAULT_GAP3 || sector.gap3 == CPC_DEFAULT_GAP3)
                        sector.gap3 = 0;
                }

                uint8_t status1 = ps->status1, status2 = ps->status2;
                bool id_crc_error = (status1 & SR1_CRC_ERROR) != 0;
                bool data_not_found = (status2 & SR2_MISSING_ADDRESS_MARK) != 0;
                bool data_crc_error = (status2 & SR2_CRC_ERROR_IN_SECTOR_DATA) != 0;
                bool deleted_dam = (status2 & SR2_SECTOR_WITH_DELETED_DATA) != 0;

                // uPD765 sets both id and data flags for data CRC errors
                if (data_crc_error)
                    id_crc_error = false;
                else if (id_crc_error)
                    sector.set_badidcrc();

                // Check for an impossible flag combo, used for storing placeholder sectors (Logo Professor test)
                if (status1 & SR1_CRC_ERROR && status2 & SR2_MISSING_ADDRESS_MARK)
                {
                    Message(msgWarning, "unsupported placeholder sector on %s", CHSR(cyl, head, sec, sector.header.sector));
                    status2 &= ~SR2_MISSING_ADDRESS_MARK;
                }

                // Check for bits that shouldn't be set in the status bytes
                if ((status1 & (SR1_WRITE_PROTECT_DETECTED | SR1_RESERVED1 | SR1_RESERVED2)) ||
                    (status2 & (SR2_SCAN_COMMAND_FAILED | SR2_SCAN_COMMAND_EQUAL | SR2_RESERVED)))
                {
                    Message(msgWarning, "invalid status (ST1=%02X ST2=%02X) for %s", status1, status2, CHSR(cyl, head, sec, sector.header.sector));

                    // Clear the unexpected bits and continue
                    status1 &= ~(SR1_WRITE_PROTECT_DETECTED | SR1_RESERVED1 | SR1_RESERVED2);
                    status2 &= ~(SR2_SCAN_COMMAND_FAILED | SR2_SCAN_COMMAND_EQUAL | SR2_RESERVED);
                }

                // Match expected flag combinations, to identify unusual combinations that could indicate a bogus dump
                if (!(
                    (status1 == SR1_SUCCESS && status2 == SR2_SUCCESS) ||                   // normal data
                    (status1 == SR1_SUCCESS && status2 == SR2_SECTOR_WITH_DELETED_DATA) ||  // deleted data
                    (status1 == SR1_END_OF_CYLINDER && status2 == SR2_SUCCESS) ||                   // end of track?
                    (status1 == SR1_CRC_ERROR && status2 == SR2_SUCCESS) ||                 // id crc error
                    (status1 == SR1_CRC_ERROR && status2 == SR2_CRC_ERROR_IN_SECTOR_DATA) ||    // normal data CRC error
                    (status1 == SR1_CRC_ERROR && status2 == (SR2_CRC_ERROR_IN_SECTOR_DATA | SR2_SECTOR_WITH_DELETED_DATA)) ||   // deleted data CRC error
                    (status1 == SR1_CANNOT_FIND_ID_ADDRESS && status2 == SR2_MISSING_ADDRESS_MARK) ||       // data field missing (some FDCs set AM in ST1)
                    (status1 == SR1_SUCCESS && status2 == SR2_MISSING_ADDRESS_MARK) ||      // data field missing (some FDCs don't)
                    (status1 == SR1_CANNOT_FIND_SECTOR_ID && status2 == SR2_SUCCESS) ||                 // CHRN mismatch
                    (status1 == SR1_CANNOT_FIND_SECTOR_ID && status2 == SR2_WRONG_CYLINDER_DETECTED)        // CHRN mismatch, including wrong cylinder
                    ))
                {
                    Message(msgWarning, "unusual status flags (ST1=%02X ST2=%02X) for %s", status1, status2, CHSR(cyl, head, sec, sector.header.sector));
                }

                auto native_size = sector.size();
                auto data_size = fEDSK ? (ps->datahigh << 8) | ps->datalow : Sector::SizeCodeToLength(th.size);
                auto num_copies = data_not_found ? 0 : 1;

                // EDSK data field with gap data or multiple copies?
                if (fEDSK && data_size > native_size)
                {
                    // Multiple error copies extension?
                    // Also accept 48K as 3x16K copies, as found in early public test images.
                    if (data_crc_error && ((data_size % native_size) == 0 || data_size == 49152))
                    {
                        // Accept 48K as 3x16K, regardless of native size
                        if (data_size == 49152)
                            num_copies = 3;

                        // Otherwise it's a straight multiple
                        else
                            num_copies = data_size / native_size;

                        // Calculate the size stored for each copy
                        data_size /= num_copies;
                    }
                }

                // Process each copy
                for (auto u = 0; u < num_copies; ++u)
                {
                    // Allocate enough space for the data, with at least the native size
                    Data data(data_size);

                    // Read the data copy
                    if (!file.read(data))
                        throw util::exception("short file reading ", cylhead, " sector ", sector.header.sector);

                    // CPDRead sometimes stores too much data. If we find a data size that is an exact multiple on an
                    // error free sector, trim it down to the natural size.
                    if (opt.fix != 0 && disk->metadata["creator"].substr(0, 3) == "CPD" &&
                        data_size > native_size && !data_crc_error && !(data_size % native_size))
                    {
                        // Example: Discology +3.dsk (SDP)
                        Message(msgFix, "dropping suspicious excess data on %s", CHSR(cyl, head, sec, sector.header.sector));
                        data.resize(native_size);
                    }

                    // Data CRC, size 1 above multiple of native, and dummy marker byte at the end of the data?
                    // ToDo: document horrid hack
                    if (data_crc_error && (data_size % native_size) == 1 && data[data_size - 1] == 123)
                    {
                        // Remove the dummy byte
                        data.resize(--data_size);
                    }

                    // Old-style DSK images have some restrictions
                    if (!fEDSK)
                    {
                        // Sectors without a data field have no data
                        if (id_crc_error || data_not_found)
                            continue;

                        // Gap data is not supported
                        if (data_size > native_size)
                            data.resize(data_size);
                    }

                    if (id_crc_error || data_not_found)
                        Message(msgWarning, "ignoring stored data on %s, which has no data field", CHSR(cyl, head, sec, sector.header.sector));
                    else
                    {
                        auto res = sector.add(std::move(data), data_crc_error, deleted_dam ? 0xf8 : 0xfb);
                        if (res == Sector::Merge::Unchanged)
                            Message(msgInfo, "ignored identical data copy of %s", CHSR(cyl, head, sec, sector.header.sector));
                    }
                }

                track.add(std::move(sector));
            }

            // Calculate the used track size, rounded up to the next 256 bytes
            auto uTrackEnd = (file.tell() + 0xff) & ~0xff;

            // Seek past the size indicated by the index
            file.seek(uTrackStart + uTrackSize);

            // With EDSK images the used size should match what the index says
            if (fEDSK && (uTrackEnd - uTrackStart) != uTrackSize)
            {
                // If the low 16-bits are different, we'll stick with trusting the index size
                if (((uTrackEnd - uTrackStart) & 0xffff) != uTrackSize)
                    Message(msgWarning, "%s size (%u) does not match index entry (%u)", CH(cyl, head), uTrackEnd - uTrackStart, uTrackSize);
                else
                {
                    // The track size probably overflowed (some WinAPE images), so trust the used size
                    Message(msgWarning, "%s size (%u) does not match index entry (%u)", CH(cyl, head), uTrackEnd - uTrackStart, uTrackSize);
                    file.seek(uTrackEnd);
                }
            }

            // Legacy EDSK images only store 6K data for 8K sectors, so any
            // checksum bytes the disk may have had are lost.
            if (!fWarned6K && track.is_8k_sector() && track[0].data_size() == 6144)
            {
                Message(msgWarning, "missing checksums needed to verify 8K sector integrity");
                fWarned6K = true;
            }

            disk->write(cylhead, std::move(track));
        }
    }

    // Check for Offset-Info header at normal file end
    EDSK_OFFSETS eo;
    if (fEDSK && file.read(&eo, sizeof(eo), 1))
    {
        if (!memcmp(eo.signature, EDSK_OFFSETS_SIG, 11))
        {
            Range(cyls, heads).each([&](const CylHead& cylhead) {
                auto track = disk->read_track(cylhead);

                uint16_t val;
                if (file.read(&val, sizeof(val), 1))
                    track.tracklen = util::letoh(val) * 16; // convert to bitstream bits

                for (auto& sector : track.sectors())
                {
                    if (file.read(&val, sizeof(val), 1))
                        sector.offset = util::letoh(val) * 16;  // convert to bitstream bits
                }

                disk->write(cylhead, std::move(track));
                });
        }
        else
        {
            // Undo non-matching read
            file.seek(file.tell() - sizeof(eo));
        }
    }

    // Check for blank track headers that RealSpectrum adds to files, despite the spec saying it shouldn't:
    // "A size of "0" indicates an unformatted track. In this case there is no data, and no track
    //  information block for this track in the image file!"
    EDSK_TRACK* pth = reinterpret_cast<EDSK_TRACK*>(ab);
    while (file.read(ab, sizeof(ab), 1))
    {
        if (!memcmp(pth->signature, EDSK_TRACK_SIG, 10) && !pth->sectors)
        {
            // Example: Fun School 2 For The Over-8s.dsk (SDP +3)
            Message(msgWarning, "blank %s should not have EDSK track block", CH(pth->track, pth->side));
        }
        else
        {
            // Undo non-matching read
            file.seek(file.tell() - sizeof(ab));
            break;
        }
    }

    size_t uTail = file.size() - file.tell();
    if (uTail)
    {
        auto pbTail = file.data().data() + file.tell();

        if (!memcmp(pbTail, pbTail + 1, uTail - 1))
        {
            // Example: Compilation Disk 048 (19xx)(-).zip  (TOSEC CPC Compilations)
            Message(msgWarning, "file ends with %u bytes of %02X filler", uTail, *pbTail);
        }
        else
        {
            // Example: Silva (1985)(Lankhor)(fr)[cr Genesis][t Genesis].zip (TOSEC CPC Games)
            Message(msgWarning, "%u bytes of unused data found at end of file:", uTail);
            util::hex_dump(file.data().begin(), file.data().end(), file.tell());
        }
    }

    disk->strType = "EDSK";
    return true;
}